

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O3

Matrix3x3 *
getAngVelSkewSymmetricMatrixFromMeasurements
          (Matrix3x3 *__return_storage_ptr__,Vector3 meas,Direction *vectorDir,double confidenceMeas
          ,Rotation *R)

{
  double *pdVar1;
  Index col;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  Direction va_hat;
  type tmp;
  double local_98 [3];
  Direction local_80;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  
  iDynTree::Rotation::inverse();
  iDynTree::Rotation::changeCoordFrameOf(&local_80);
  dVar5 = meas.m_data[2] * meas.m_data[2] +
          meas.m_data[1] * meas.m_data[1] + meas.m_data[0] * meas.m_data[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar5;
  auVar3 = sqrtpd(auVar3,auVar3);
  auVar4._0_8_ = auVar3._0_8_;
  if (auVar4._0_8_ != 1.0 && 0.0 < dVar5) {
    meas.m_data[2] = meas.m_data[2] / auVar4._0_8_;
    auVar4._8_8_ = auVar4._0_8_;
    meas.m_data._0_16_ = divpd((undefined1  [16])meas.m_data._0_16_,auVar4);
  }
  local_98[2] = local_80.super_Vector3.m_data[2];
  local_98[0] = local_80.super_Vector3.m_data[0];
  local_98[1] = local_80.super_Vector3.m_data[1];
  pdVar1 = &local_58;
  lVar2 = 0;
  do {
    dVar5 = local_98[lVar2];
    pdVar1[-2] = dVar5 * meas.m_data[0];
    pdVar1[-1] = dVar5 * meas.m_data[1];
    *pdVar1 = dVar5 * meas.m_data[2];
    lVar2 = lVar2 + 1;
    pdVar1 = pdVar1 + 3;
  } while (lVar2 != 3);
  dVar5 = confidenceMeas * 0.5;
  __return_storage_ptr__->m_data[0] = (local_68 - local_68) * dVar5;
  __return_storage_ptr__->m_data[1] = (dStack_50 - dStack_60) * dVar5;
  __return_storage_ptr__->m_data[2] = (local_38 - local_58) * dVar5;
  __return_storage_ptr__->m_data[3] = (dStack_60 - dStack_50) * dVar5;
  __return_storage_ptr__->m_data[4] = (local_48 - local_48) * dVar5;
  __return_storage_ptr__->m_data[5] = (dStack_30 - dStack_40) * dVar5;
  __return_storage_ptr__->m_data[6] = (local_58 - local_38) * dVar5;
  __return_storage_ptr__->m_data[7] = (dStack_40 - dStack_30) * dVar5;
  __return_storage_ptr__->m_data[8] = (local_28 - local_28) * dVar5;
  return __return_storage_ptr__;
}

Assistant:

iDynTree::Matrix3x3 getAngVelSkewSymmetricMatrixFromMeasurements(iDynTree::Vector3 meas, const iDynTree::Direction& vectorDir, double confidenceMeas, const iDynTree::Rotation& R)
{
    using iDynTree::toEigen;

    ///< compute \f$ {{^A}{\hat{R}}_B}^T e_3 \f$ where \f$ e_3 \f$ is the vectorDir
    iDynTree::Direction va_hat = R.inverse().changeCoordFrameOf(vectorDir);
    iDynTree::Vector3 vectorial_estimate = iDynTree::Vector3(va_hat.data(), 3);

    ///< compute vectorial direction from the measurement normalized
    if (toEigen(meas).norm() != 1)
    {
        toEigen(meas).normalize();
    }

    iDynTree::Matrix3x3 Adyn = getMatrixFromVectorVectorMultiplication(meas, vectorial_estimate);
    iDynTree::Matrix3x3 Sdyn;
    auto A(toEigen(Adyn));
    auto S(toEigen(Sdyn));

    S = (A - A.transpose())*(confidenceMeas*0.5);

    return Sdyn;
}